

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::Equals,true,false,true,false>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  long lVar5;
  long lVar6;
  sel_t sVar7;
  int64_t *piVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  idx_t iVar16;
  int iVar17;
  long lVar18;
  interval_t *left;
  
  if (count + 0x3f < 0x40) {
    iVar16 = 0;
  }
  else {
    puVar2 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar16 = 0;
    uVar11 = 0;
    uVar12 = 0;
    do {
      if (puVar2 == (unsigned_long *)0x0) {
        uVar9 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar9 = count;
        }
LAB_003fe575:
        uVar14 = uVar12;
        if (uVar12 < uVar9) {
          psVar3 = sel->sel_vector;
          iVar1 = ldata->days;
          lVar6 = ldata->micros;
          lVar5 = lVar6 / 86400000000 + (long)iVar1;
          iVar17 = ldata->months;
          psVar4 = true_sel->sel_vector;
          piVar8 = &rdata[uVar12].micros;
          do {
            uVar10 = uVar12;
            if (psVar3 != (sel_t *)0x0) {
              uVar10 = (ulong)psVar3[uVar12];
            }
            lVar15 = *piVar8;
            if (iVar1 == *(int32_t *)((long)piVar8 + -4) &&
                iVar17 == ((interval_t *)(piVar8 + -1))->months) {
              uVar14 = 1;
              lVar18 = (long)iVar1;
              if (lVar6 != lVar15) goto LAB_003fe66f;
            }
            else {
              lVar18 = (long)*(int32_t *)((long)piVar8 + -4);
LAB_003fe66f:
              lVar18 = lVar18 + lVar15 / 86400000000;
              if (lVar5 / 0x1e + (long)iVar17 ==
                  (long)((interval_t *)(piVar8 + -1))->months + lVar18 / 0x1e) {
                uVar14 = 0;
                if (lVar5 % 0x1e == lVar18 % 0x1e) {
                  uVar14 = (ulong)(lVar6 % 86400000000 == lVar15 % 86400000000);
                }
              }
              else {
                uVar14 = 0;
              }
            }
            psVar4[iVar16] = (sel_t)uVar10;
            iVar16 = uVar14 + iVar16;
            uVar12 = uVar12 + 1;
            piVar8 = piVar8 + 2;
            uVar14 = uVar9;
          } while (uVar9 != uVar12);
        }
      }
      else {
        uVar10 = puVar2[uVar11];
        uVar9 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar9 = count;
        }
        uVar14 = uVar9;
        if (uVar10 != 0) {
          if (uVar10 == 0xffffffffffffffff) goto LAB_003fe575;
          uVar14 = uVar12;
          if (uVar12 < uVar9) {
            psVar3 = sel->sel_vector;
            psVar4 = true_sel->sel_vector;
            piVar8 = &rdata[uVar12].micros;
            uVar13 = 0;
            do {
              if (psVar3 == (sel_t *)0x0) {
                sVar7 = (int)uVar12 + (int)uVar13;
              }
              else {
                sVar7 = psVar3[uVar12 + uVar13];
              }
              if ((uVar10 >> (uVar13 & 0x3f) & 1) == 0) {
                uVar14 = 0;
              }
              else {
                iVar1 = ldata->days;
                lVar5 = ldata->micros;
                lVar6 = *piVar8;
                iVar17 = *(int32_t *)((long)piVar8 + -4);
                if ((*(int32_t *)((long)piVar8 + -4) != iVar1 ||
                     ((interval_t *)(piVar8 + -1))->months != ldata->months) ||
                   (uVar14 = 1, iVar17 = iVar1, lVar5 != lVar6)) {
                  lVar15 = (long)iVar1 + lVar5 / 86400000000;
                  lVar18 = (long)iVar17 + lVar6 / 86400000000;
                  if ((long)ldata->months + lVar15 / 0x1e ==
                      (long)((interval_t *)(piVar8 + -1))->months + lVar18 / 0x1e) {
                    uVar14 = 0;
                    if (lVar15 % 0x1e == lVar18 % 0x1e) {
                      uVar14 = (ulong)(lVar5 % 86400000000 == lVar6 % 86400000000);
                    }
                  }
                  else {
                    uVar14 = 0;
                  }
                }
              }
              psVar4[iVar16] = sVar7;
              iVar16 = uVar14 + iVar16;
              uVar13 = uVar13 + 1;
              piVar8 = piVar8 + 2;
              uVar14 = uVar9;
            } while (uVar9 - uVar12 != uVar13);
          }
        }
      }
      uVar11 = uVar11 + 1;
      uVar12 = uVar14;
    } while (uVar11 != count + 0x3f >> 6);
  }
  return iVar16;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}